

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmem.cpp
# Opt level: O0

MemNode * asmjit::vMemMgrFindNodeByPtr(VMemMgr *self,uint8_t *mem)

{
  uint8_t *puVar1;
  uint8_t *nodeEnd;
  uint8_t *nodeMem;
  MemNode *node;
  uint8_t *mem_local;
  VMemMgr *self_local;
  
  node = self->_root;
  while( true ) {
    while( true ) {
      if (node == (MemNode *)0x0) {
        return (MemNode *)0x0;
      }
      puVar1 = (node->super_RbNode).mem;
      if (puVar1 <= mem) break;
      node = (MemNode *)(node->super_RbNode).node[0];
    }
    if (mem < puVar1 + node->size) break;
    node = (MemNode *)(node->super_RbNode).node[1];
  }
  return node;
}

Assistant:

static MemNode* vMemMgrFindNodeByPtr(VMemMgr* self, uint8_t* mem) noexcept {
  MemNode* node = self->_root;
  while (node) {
    uint8_t* nodeMem = node->mem;

    // Go left.
    if (mem < nodeMem) {
      node = static_cast<MemNode*>(node->node[0]);
      continue;
    }

    // Go right.
    uint8_t* nodeEnd = nodeMem + node->size;
    if (mem >= nodeEnd) {
      node = static_cast<MemNode*>(node->node[1]);
      continue;
    }

    // Match.
    break;
  }
  return node;
}